

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O0

void highbd_dc_predictor(uint16_t *dst,ptrdiff_t stride,int bw,int bh,uint16_t *above,uint16_t *left
                        ,int bd)

{
  int in_ECX;
  int in_EDX;
  long in_RSI;
  void *in_RDI;
  long in_R8;
  long in_R9;
  int count;
  int sum;
  int expected_dc;
  int r;
  int i;
  undefined4 local_38;
  undefined4 local_30;
  undefined4 local_2c;
  undefined8 local_8;
  
  local_38 = 0;
  for (local_2c = 0; local_2c < in_EDX; local_2c = local_2c + 1) {
    local_38 = (uint)*(ushort *)(in_R8 + (long)local_2c * 2) + local_38;
  }
  for (local_2c = 0; local_2c < in_ECX; local_2c = local_2c + 1) {
    local_38 = (uint)*(ushort *)(in_R9 + (long)local_2c * 2) + local_38;
  }
  local_8 = in_RDI;
  for (local_30 = 0; local_30 < in_ECX; local_30 = local_30 + 1) {
    aom_memset16(local_8,(local_38 + (in_EDX + in_ECX >> 1)) / (in_EDX + in_ECX),(long)in_EDX);
    local_8 = (void *)(in_RSI * 2 + (long)local_8);
  }
  return;
}

Assistant:

static inline void highbd_dc_predictor(uint16_t *dst, ptrdiff_t stride, int bw,
                                       int bh, const uint16_t *above,
                                       const uint16_t *left, int bd) {
  int i, r, expected_dc, sum = 0;
  const int count = bw + bh;
  (void)bd;

  for (i = 0; i < bw; i++) {
    sum += above[i];
  }
  for (i = 0; i < bh; i++) {
    sum += left[i];
  }

  expected_dc = (sum + (count >> 1)) / count;

  for (r = 0; r < bh; r++) {
    aom_memset16(dst, expected_dc, bw);
    dst += stride;
  }
}